

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *__x;
  size_t written;
  ByteSequence result;
  undefined1 local_a0 [8];
  ByteSequence output;
  allocator<unsigned_char> local_71;
  undefined1 local_70 [8];
  ByteSequence input;
  uint8_t out [20];
  uchar auStack_38 [8];
  uint8_t in [19];
  int DATASIZE;
  int rc;
  char **argv_local;
  int argc_local;
  
  stack0xffffffffffffffe0 = 0x13;
  auStack_38[0] = '\0';
  auStack_38[1] = '\0';
  auStack_38[2] = '\0';
  auStack_38[3] = '\n';
  auStack_38[4] = '\x14';
  auStack_38[5] = '\0';
  auStack_38[6] = '(';
  auStack_38[7] = '\0';
  in[0] = '<';
  in[1] = 'F';
  in[2] = 'P';
  in[3] = 'Z';
  in[4] = 'd';
  in[5] = 'n';
  in[6] = '\0';
  in[7] = 0x82;
  in[8] = '\0';
  in[9] = 0x96;
  in[10] = 0xa0;
  std::allocator<unsigned_char>::allocator(&local_71);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_70,auStack_38,in + 0xb,
             &local_71);
  std::allocator<unsigned_char>::~allocator(&local_71);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  cobs::cobs_encode((ByteSequence *)
                    &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteSequence *)local_70);
  __x = &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
  cobs::cobs_decode((ByteSequence *)&written,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  cobs_encode(auStack_38,0x13,
              (uint8_t *)
              &input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&written);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{


  int rc= 0;
  const int DATASIZE = 19;

  uint8_t in[] = {0,0,0,10,20,0,40,0,60,70,80,90,100,110,0,130,0,150,160};
  uint8_t out[DATASIZE + 1 + DATASIZE / 254];

  
  cobs::ByteSequence input( in, in+DATASIZE);
  cobs::ByteSequence output;

  output =	cobs::cobs_encode(input);
  cobs::ByteSequence result = cobs::cobs_decode(output);

 size_t written =  cobs_encode(in, DATASIZE, out);
  
  return(rc);


}